

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O0

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt,jpc_enc_band_t *band,jpc_enc_cblk_t *cblk)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  jas_stream_t *pjVar4;
  jpc_mqenc_t *pjVar5;
  jpc_enc_pass_t *pjVar6;
  jas_matind_t jVar7;
  jas_matind_t jVar8;
  jas_matrix_t *pjVar9;
  long lVar10;
  bool bVar11;
  int local_b4;
  int local_b0;
  jpc_enc_pass_t *local_a8;
  int local_94;
  int local_90;
  jpc_enc_pass_t *local_80;
  uint local_74;
  int local_6c;
  int c;
  int termmode;
  int segsym;
  int vcausal;
  jpc_enc_pass_t *termpass;
  jpc_bitstream_t *bout;
  int t;
  int passtype;
  int ret;
  int adjust;
  int n;
  int bitpos;
  jpc_enc_pass_t *endpasses;
  jpc_enc_pass_t *pass;
  jpc_enc_cblk_t *cblk_local;
  jpc_enc_band_t *band_local;
  jpc_enc_tcmpt_t *tcmpt_local;
  
  termpass = (jpc_enc_pass_t *)0x0;
  pjVar4 = jas_stream_memopen((char *)0x0,0);
  cblk->stream = pjVar4;
  if (cblk->stream == (jas_stream_t *)0x0) {
    __assert_fail("cblk->stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd1,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  pjVar5 = jpc_mqenc_create(0x13,cblk->stream);
  cblk->mqenc = pjVar5;
  if (cblk->mqenc == (jpc_mqenc_t *)0x0) {
    __assert_fail("cblk->mqenc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd3,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  jpc_mqenc_setctxs(cblk->mqenc,0x13,jpc_mqctxs);
  if (cblk->numbps < 1) {
    local_74 = 0;
  }
  else {
    local_74 = cblk->numbps * 3 - 2;
  }
  cblk->numpasses = local_74;
  if (cblk->numpasses == 0) {
    cblk->passes = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar6 = (jpc_enc_pass_t *)jas_alloc2((ulong)cblk->numpasses,0x48);
    cblk->passes = pjVar6;
    if (cblk->passes == (jpc_enc_pass_t *)0x0) {
      __assert_fail("cblk->passes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0xd9,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
  }
  if (cblk->passes == (jpc_enc_pass_t *)0x0) {
    local_80 = (jpc_enc_pass_t *)0x0;
  }
  else {
    local_80 = cblk->passes + cblk->numpasses;
  }
  for (endpasses = cblk->passes; endpasses != local_80; endpasses = endpasses + 1) {
    endpasses->start = 0;
    endpasses->end = 0;
    iVar1 = JPC_ISTERMINATED((int)(((long)endpasses - (long)cblk->passes) / 0x48),0,cblk->numpasses,
                             (uint)((tcmpt->cblksty & 4U) != 0),(uint)((tcmpt->cblksty & 1U) != 0));
    endpasses->term = iVar1;
    iVar1 = JPC_SEGTYPE((int)(((long)endpasses - (long)cblk->passes) / 0x48),0,
                        (uint)((tcmpt->cblksty & 1U) != 0));
    endpasses->type = iVar1;
    endpasses->lyrno = 0xffffffff;
    if (endpasses == local_80 + -1) {
      if (endpasses->term != 1) {
        __assert_fail("pass->term == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0xe5,
                      "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
      }
      endpasses->term = 1;
    }
  }
  jVar7 = jas_matrix_numrows(cblk->data);
  jVar8 = jas_matrix_numcols(cblk->data);
  pjVar9 = jas_matrix_create(jVar7 + 2,jVar8 + 2);
  cblk->flags = pjVar9;
  if (cblk->flags != (jas_matrix_t *)0x0) {
    adjust = cblk->numbps + -1;
    endpasses = cblk->passes;
    ret = cblk->numpasses;
    do {
      ret = ret + -1;
      if (ret < 0) {
        ret = 0;
        if (cblk->passes == (jpc_enc_pass_t *)0x0) {
          local_a8 = (jpc_enc_pass_t *)0x0;
        }
        else {
          local_a8 = cblk->passes + cblk->numpasses;
        }
        endpasses = cblk->passes;
        do {
          if (endpasses == local_a8) {
            if (termpass != (jpc_enc_pass_t *)0x0) {
              jpc_bitstream_close((jpc_bitstream_t *)termpass);
            }
            return 0;
          }
          if (endpasses->start < ret) {
            endpasses->start = ret;
          }
          if (endpasses->end < ret) {
            endpasses->end = ret;
          }
          if (endpasses->term == 0) {
            _segsym = endpasses;
            while( true ) {
              bVar11 = false;
              if (((long)_segsym - (long)endpasses) / 0x48 < (long)(ulong)cblk->numpasses) {
                bVar11 = _segsym->term == 0;
              }
              if (!bVar11) break;
              _segsym = _segsym + 1;
            }
            if (endpasses->type == 1) {
              uVar2 = (uint)((endpasses->mqencstate).lastbyte == 0xff);
              if ((endpasses->mqencstate).ctreg < 5) {
                passtype = uVar2 + 5;
              }
              else {
                passtype = uVar2 + 4;
              }
              endpasses->end = passtype + endpasses->end;
            }
            if (_segsym->end < endpasses->end) {
              endpasses->end = _segsym->end;
            }
            iVar1 = getthebyte(cblk->stream,(long)(endpasses->end + -1));
            if (iVar1 == -1) {
              abort();
            }
            if (iVar1 == 0xff) {
              endpasses->end = endpasses->end + 1;
            }
            if (endpasses->end < ret) {
              local_b0 = ret;
            }
            else {
              local_b0 = endpasses->end;
            }
            ret = local_b0;
          }
          else {
            if (endpasses->end < ret) {
              local_b4 = ret;
            }
            else {
              local_b4 = endpasses->end;
            }
            ret = local_b4;
          }
          endpasses = endpasses + 1;
        } while( true );
      }
      if (endpasses->type != 1) {
        if (endpasses->type != 2) {
          __assert_fail("pass->type == JPC_SEG_RAW",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0xf7,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        if ((termpass == (jpc_enc_pass_t *)0x0) &&
           (termpass = (jpc_enc_pass_t *)jpc_bitstream_sopen(cblk->stream,"w"),
           termpass == (jpc_enc_pass_t *)0x0)) {
          return -1;
        }
      }
      iVar1 = (int)((((long)endpasses - (long)cblk->passes) / 0x48 + 2) % 3);
      lVar10 = jas_stream_tell(cblk->stream);
      endpasses->start = (int)lVar10;
      if (adjust < 0) {
        __assert_fail("bitpos >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0x108,
                      "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
      }
      uVar2 = (uint)((tcmpt->cblksty & 8U) != 0);
      if (endpasses->term == 0) {
        local_6c = 0;
      }
      else {
        local_6c = ((tcmpt->cblksty & 0x10U) != 0) + 1;
      }
      if (iVar1 == 0) {
        if (endpasses->type == 1) {
          local_90 = jpc_encsigpass(cblk->mqenc,adjust,band->orient,uVar2,cblk->flags,cblk->data,
                                    local_6c,&endpasses->nmsedec);
        }
        else {
          local_90 = jpc_encrawsigpass((jpc_bitstream_t *)termpass,adjust,uVar2,cblk->flags,
                                       cblk->data,local_6c,&endpasses->nmsedec);
        }
        t = local_90;
      }
      else if (iVar1 == 1) {
        if (endpasses->type == 1) {
          local_94 = jpc_encrefpass(cblk->mqenc,adjust,cblk->flags,cblk->data,local_6c,
                                    &endpasses->nmsedec);
        }
        else {
          local_94 = jpc_encrawrefpass((jpc_bitstream_t *)termpass,adjust,cblk->flags,cblk->data,
                                       local_6c,&endpasses->nmsedec);
        }
        t = local_94;
      }
      else {
        if (iVar1 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0x127,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        if (endpasses->type != 1) {
          __assert_fail("pass->type == JPC_SEG_MQ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0x121,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        t = jpc_encclnpass(cblk->mqenc,adjust,band->orient,uVar2,
                           (uint)((tcmpt->cblksty & 0x20U) != 0),cblk->flags,cblk->data,local_6c,
                           &endpasses->nmsedec);
      }
      if (t != 0) {
        if (termpass != (jpc_enc_pass_t *)0x0) {
          jpc_bitstream_close((jpc_bitstream_t *)termpass);
        }
        return -1;
      }
      if (endpasses->type == 1) {
        if (endpasses->term != 0) {
          jpc_mqenc_init(cblk->mqenc);
        }
        jpc_mqenc_getstate(cblk->mqenc,&endpasses->mqencstate);
        lVar10 = jas_stream_tell(cblk->stream);
        endpasses->end = (int)lVar10;
        if ((tcmpt->cblksty & 2U) != 0) {
          jpc_mqenc_setctxs(cblk->mqenc,0x13,jpc_mqctxs);
        }
      }
      else if (endpasses->term == 0) {
        lVar10 = jas_stream_tell(cblk->stream);
        iVar3 = jpc_bitstream_pending((jpc_bitstream_t *)termpass);
        endpasses->end = (int)lVar10 + iVar3;
      }
      else {
        iVar3 = jpc_bitstream_pending((jpc_bitstream_t *)termpass);
        if (iVar3 != 0) {
          jpc_bitstream_outalign((jpc_bitstream_t *)termpass,0x2a);
        }
        jpc_bitstream_close((jpc_bitstream_t *)termpass);
        termpass = (jpc_enc_pass_t *)0x0;
        lVar10 = jas_stream_tell(cblk->stream);
        endpasses->end = (int)lVar10;
      }
      endpasses->wmsedec =
           ((double)band->rlvl->tcmpt->synweight / 8192.0) *
           ((double)band->rlvl->tcmpt->synweight / 8192.0) * ((double)band->synweight / 8192.0) *
           ((double)band->synweight / 8192.0) * ((double)band->absstepsize / 8192.0) *
           ((double)band->absstepsize / 8192.0) * (double)(1 << ((byte)adjust & 0x1f)) *
           (double)(1 << ((byte)adjust & 0x1f)) * ((double)endpasses->nmsedec / 8192.0);
      endpasses->cumwmsedec = endpasses->wmsedec;
      if (endpasses != cblk->passes) {
        endpasses->cumwmsedec = endpasses[-1].cumwmsedec + endpasses->cumwmsedec;
      }
      if (iVar1 == 2) {
        adjust = adjust + -1;
      }
      endpasses = endpasses + 1;
    } while( true );
  }
  __assert_fail("cblk->flags",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                ,0xec,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
}

Assistant:

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt, jpc_enc_band_t *band, jpc_enc_cblk_t *cblk)
{
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	int bitpos;
	int n;
	int adjust;
	int ret;
	int passtype;
	int t;
	jpc_bitstream_t *bout;
	jpc_enc_pass_t *termpass;
	int vcausal;
	int segsym;
	int termmode;
	int c;

	bout = 0;

	cblk->stream = jas_stream_memopen(0, 0);
	assert(cblk->stream);
	cblk->mqenc = jpc_mqenc_create(JPC_NUMCTXS, cblk->stream);
	assert(cblk->mqenc);
	jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);

	cblk->numpasses = (cblk->numbps > 0) ? (3 * cblk->numbps - 2) : 0;
	if (cblk->numpasses > 0) {
		cblk->passes = jas_alloc2(cblk->numpasses, sizeof(jpc_enc_pass_t));
		assert(cblk->passes);
	} else {
		cblk->passes = 0;
	}
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		pass->start = 0;
		pass->end = 0;
		pass->term = JPC_ISTERMINATED(pass - cblk->passes, 0, cblk->numpasses, (tcmpt->cblksty & JPC_COX_TERMALL) != 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->type = JPC_SEGTYPE(pass - cblk->passes, 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->lyrno = -1;
if (pass == endpasses - 1) {
assert(pass->term == 1);
	pass->term = 1;
}
	}

	cblk->flags = jas_matrix_create(jas_matrix_numrows(cblk->data) + 2,
	  jas_matrix_numcols(cblk->data) + 2);
	assert(cblk->flags);


	bitpos = cblk->numbps - 1;
	pass = cblk->passes;
	n = cblk->numpasses;
	while (--n >= 0) {

		if (pass->type == JPC_SEG_MQ) {
			/* NOP */
		} else {
			assert(pass->type == JPC_SEG_RAW);
			if (!bout) {
				bout = jpc_bitstream_sopen(cblk->stream, "w");
				if (!bout)
					return -1;
			}
		}

#if 1
		passtype = (pass - cblk->passes + 2) % 3;
#else
		passtype = JPC_PASSTYPE(pass - cblk->passes + 2);
#endif
		pass->start = jas_stream_tell(cblk->stream);
#if 0
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif
		assert(bitpos >= 0);
		vcausal = (tcmpt->cblksty & JPC_COX_VSC) != 0;
		segsym = (tcmpt->cblksty & JPC_COX_SEGSYM) != 0;
		if (pass->term) {
			termmode = ((tcmpt->cblksty & JPC_COX_PTERM) ?
			  JPC_MQENC_PTERM : JPC_MQENC_DEFTERM) + 1;
		} else {
			termmode = 0;
		}
		switch (passtype) {
		case JPC_SIGPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encsigpass(cblk->mqenc,
			  bitpos, band->orient, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec) :
			  jpc_encrawsigpass(bout, bitpos, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec);
			break;
		case JPC_REFPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encrefpass(cblk->mqenc,
			  bitpos, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec) : jpc_encrawrefpass(bout, bitpos,
			  cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		case JPC_CLNPASS:
			assert(pass->type == JPC_SEG_MQ);
			ret = jpc_encclnpass(cblk->mqenc, bitpos, band->orient,
			  vcausal, segsym, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		default:
			assert(0);
			break;
		}

		if (ret) {
			if (bout) {
				jpc_bitstream_close(bout);
			}
			return -1;
		}

		if (pass->type == JPC_SEG_MQ) {
			if (pass->term) {
				jpc_mqenc_init(cblk->mqenc);
			}
			jpc_mqenc_getstate(cblk->mqenc, &pass->mqencstate);
			pass->end = jas_stream_tell(cblk->stream);
			if (tcmpt->cblksty & JPC_COX_RESET) {
				jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);
			}
		} else {
			if (pass->term) {
				if (jpc_bitstream_pending(bout)) {
					jpc_bitstream_outalign(bout, 0x2a);
				}
				jpc_bitstream_close(bout);
				bout = 0;
				pass->end = jas_stream_tell(cblk->stream);
			} else {
				pass->end = jas_stream_tell(cblk->stream) +
				  jpc_bitstream_pending(bout);
/* NOTE - This will not work.  need to adjust by # of pending output bytes */
			}
		}
#if 0
/* XXX - This assertion fails sometimes when various coding modes are used.
This seems to be harmless, but why does it happen at all? */
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif

		pass->wmsedec = jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->absstepsize) * jpc_fixtodbl(band->absstepsize) *
		  ((double) (1 << bitpos)) * ((double)(1 << bitpos)) *
		  jpc_fixtodbl(pass->nmsedec);
		pass->cumwmsedec = pass->wmsedec;
		if (pass != cblk->passes) {
			pass->cumwmsedec += pass[-1].cumwmsedec;
		}
		if (passtype == JPC_CLNPASS) {
			--bitpos;
		}
		++pass;
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	n = 0;
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		if (pass->start < n) {
			pass->start = n;
		}
		if (pass->end < n) {
			pass->end = n;
		}
		if (!pass->term) {
			termpass = pass;
			while (termpass - pass < cblk->numpasses &&
			  !termpass->term) {
				++termpass;
			}
			if (pass->type == JPC_SEG_MQ) {
				t = (pass->mqencstate.lastbyte == 0xff) ? 1 : 0;
				if (pass->mqencstate.ctreg >= 5) {
					adjust = 4 + t;
				} else {
					adjust = 5 + t;
				}
				pass->end += adjust;
			}
			if (pass->end > termpass->end) {
				pass->end = termpass->end;
			}
			if ((c = getthebyte(cblk->stream, pass->end - 1)) == EOF) {
				abort();
			}
			if (c == 0xff) {
				++pass->end;
			}
			n = JAS_MAX(n, pass->end);
		} else {
			n = JAS_MAX(n, pass->end);
		}
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	if (bout) {
		jpc_bitstream_close(bout);
	}

	return 0;
}